

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

int __thiscall Preprocessor::evaluateCondition(Preprocessor *this)

{
  int iVar1;
  long in_FS_OFFSET;
  PP_Expression expression;
  stack<QByteArray,_QList<QByteArray>_> *in_stack_ffffffffffffff68;
  PP_Expression *this_00;
  Symbols *substituted;
  Preprocessor *this_01;
  Data *local_28;
  Symbol *pSStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pSStack_20 = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (Preprocessor *)&DAT_aaaaaaaaaaaaaaaa;
  substituted = (Symbols *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (PP_Expression *)&stack0xffffffffffffffd8;
  PP_Expression::PP_Expression((PP_Expression *)0x182fd6);
  std::stack<QByteArray,_QList<QByteArray>_>::operator=
            ((stack<QByteArray,_QList<QByteArray>_> *)this_00,in_stack_ffffffffffffff68);
  substituteUntilNewline(this_01,substituted);
  iVar1 = PP_Expression::value(this_00);
  PP_Expression::~PP_Expression((PP_Expression *)0x183010);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int Preprocessor::evaluateCondition()
{
    PP_Expression expression;
    expression.currentFilenames = currentFilenames;

    substituteUntilNewline(expression.symbols);

    return expression.value();
}